

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O0

int32 senone_mixw_read(logmath_t *logmath,senone_t *s,char *file_name,float64 mixwfloor)

{
  long lVar1;
  int32 iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  size_t sVar6;
  float64 fVar7;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar8;
  mixw_t *fw;
  uint local_80;
  uint uStack_7c;
  char eofchk;
  int32 nval;
  int32 n_cw;
  int32 n_err;
  int32 n_sen;
  int32 p;
  int32 c;
  int32 m;
  int32 f;
  int32 j;
  int32 i;
  float32 *pdf;
  int local_48;
  uint32 chksum;
  int32 chksum_present;
  int32 byteswap;
  char **argval;
  char **argname;
  FILE *fp;
  float64 mixwfloor_local;
  char *file_name_local;
  senone_t *s_local;
  logmath_t *logmath_local;
  
  fp = (FILE *)mixwfloor;
  mixwfloor_local = (float64)file_name;
  file_name_local = (char *)s;
  s_local = (senone_t *)logmath;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,0xd2,"Reading senone mixture weights: %s\n",file_name);
  argname = (char **)fopen((char *)mixwfloor_local,"rb");
  if ((FILE *)argname == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                   ,0xd5,"fopen(%s,rb) failed\n",mixwfloor_local);
    exit(1);
  }
  iVar2 = bio_readhdr((FILE *)argname,&argval,(char ***)&chksum_present,(int32 *)&chksum);
  if (iVar2 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xd9,"bio_readhdr(%s) failed\n",mixwfloor_local);
    exit(1);
  }
  local_48 = 0;
  for (f = 0; argval[f] != (char *)0x0; f = f + 1) {
    iVar3 = strcmp(argval[f],"version");
    if (iVar3 == 0) {
      iVar3 = strcmp(_chksum_present[f],"1.0");
      if (iVar3 != 0) {
        in_stack_ffffffffffffff58 = 0;
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                ,0xe1,"Version mismatch(%s): %s, expecting %s\n",mixwfloor_local,_chksum_present[f],
                "1.0");
      }
    }
    else {
      iVar3 = strcmp(argval[f],"chksum0");
      if (iVar3 == 0) {
        local_48 = 1;
      }
    }
  }
  bio_hdrarg_free(argval,_chksum_present);
  _chksum_present = (char **)0x0;
  argval = (char **)0x0;
  pdf._4_4_ = 0;
  n_cw = *(int32 *)file_name_local;
  iVar2 = bio_fread(file_name_local,4,1,(FILE *)argname,chksum,(uint32 *)((long)&pdf + 4));
  if ((((iVar2 != 1) ||
       (iVar2 = bio_fread(file_name_local + 4,4,1,(FILE *)argname,chksum,(uint32 *)((long)&pdf + 4))
       , iVar2 != 1)) ||
      (iVar2 = bio_fread(&stack0xffffffffffffff84,4,1,(FILE *)argname,chksum,
                         (uint32 *)((long)&pdf + 4)), iVar2 != 1)) ||
     (iVar2 = bio_fread(&local_80,4,1,(FILE *)argname,chksum,(uint32 *)((long)&pdf + 4)), iVar2 != 1
     )) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xf1,"bio_fread(%s) (arraysize) failed\n",mixwfloor_local);
    exit(1);
  }
  if ((n_cw != 0) && (*(int *)file_name_local != n_cw)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xf4,"#senones(%d) conflict with mapping file(%d)\n",(ulong)*(uint *)file_name_local,
            (ulong)(uint)n_cw);
    exit(1);
  }
  if (0x7ffe < *(uint *)file_name_local) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xf6,"%s: #senones (%d) exceeds limit (%d)\n",mixwfloor_local,
            (ulong)*(uint *)file_name_local,
            CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),0x7fff));
    exit(1);
  }
  if (*(int *)(file_name_local + 4) == 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xf8,"Bad #features: %d\n",(ulong)*(uint *)(file_name_local + 4));
    exit(1);
  }
  if ((int)uStack_7c < 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xfa,"Bad #mixing-wts/senone: %d\n",(ulong)uStack_7c);
    exit(1);
  }
  if (*(long *)(file_name_local + 0x18) == 0) {
    if ((*(int *)(file_name_local + 8) != 0) && (*(int *)(file_name_local + 8) != 1)) {
      __assert_fail("(s->n_mgau == 0) || (s->n_mgau == 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0xfe,"int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)");
    }
    pvVar5 = __ckd_calloc__((ulong)*(uint *)file_name_local,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                            ,0x100);
    *(void **)(file_name_local + 0x18) = pvVar5;
    if (*(int *)(file_name_local + 8) == 1) {
      for (f = 0; (uint)f < *(uint *)file_name_local; f = f + 1) {
        *(undefined4 *)(*(long *)(file_name_local + 0x18) + (long)f * 4) = 0;
      }
    }
    else {
      *(undefined4 *)(file_name_local + 8) = *(undefined4 *)file_name_local;
      for (f = 0; (uint)f < *(uint *)file_name_local; f = f + 1) {
        *(int32 *)(*(long *)(file_name_local + 0x18) + (long)f * 4) = f;
      }
    }
  }
  else if (*(int *)(file_name_local + 8) == 0) {
    __assert_fail("s->n_mgau != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x10d,"int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)");
  }
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (0x7ffe < *(uint *)(file_name_local + 8)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x10f,"%s: #gauden (%d) exceeds limit (%d)\n",mixwfloor_local,
            (ulong)*(uint *)(file_name_local + 8),CONCAT44(uVar8,0x7fff));
    exit(1);
  }
  if (local_80 != *(int *)file_name_local * *(int *)(file_name_local + 4) * uStack_7c) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x113,"%s: #float32 values(%d) doesn\'t match dimensions: %d x %d x %d\n",
            mixwfloor_local,(ulong)local_80,CONCAT44(uVar8,*(undefined4 *)file_name_local),
            *(undefined4 *)(file_name_local + 4),uStack_7c);
    exit(1);
  }
  if (((double)fp <= 0.0) || (1.0 <= (double)fp)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x11b,"mixwfloor (%e) not in range (0, 1)\n",fp);
    exit(1);
  }
  build_mgau2sen((senone_t *)file_name_local,uStack_7c);
  _j = (float32 *)
       __ckd_calloc__((long)(int)uStack_7c,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                      ,0x121);
  nval = 0;
  for (f = 0; uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20),
      (uint)f < *(uint *)file_name_local; f = f + 1) {
    p = *(int *)(*(long *)(file_name_local + 0x18) + (long)f * 4);
    m = *(int32 *)(*(long *)(file_name_local + 0x20) + (long)f * 4);
    lVar1 = *(long *)(*(long *)(file_name_local + 0x10) + (long)p * 0x18 + 0x10);
    for (c = 0; (uint)c < *(uint *)(file_name_local + 4); c = c + 1) {
      uVar4 = bio_fread(_j,4,uStack_7c,(FILE *)argname,chksum,(uint32 *)((long)&pdf + 4));
      if (uVar4 != uStack_7c) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                ,0x12d,"bio_fread(%s) (arraydata) failed\n",mixwfloor_local);
        exit(1);
      }
      fVar7 = vector_sum_norm(_j,uStack_7c);
      if (((double)fVar7 == 0.0) && (!NAN((double)fVar7))) {
        nval = nval + 1;
      }
      vector_floor((vector_t)_j,uStack_7c,(float32)(float)(double)fp);
      vector_sum_norm(_j,uStack_7c);
      for (n_sen = 0; n_sen < (int)uStack_7c; n_sen = n_sen + 1) {
        iVar3 = logmath_log((logmath_t *)s_local,(float64)(double)(float)_j[n_sen]);
        n_err = -iVar3;
        *(char *)(*(long *)(*(long *)(lVar1 + (long)c * 0x10 + 8) + (long)m * 8) + (long)n_sen) =
             (char)n_err;
      }
    }
  }
  if (0 < nval) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x13e,"Weight normalization failed for %d senones\n",(ulong)(uint)nval);
  }
  ckd_free(_j);
  if (local_48 != 0) {
    bio_verify_chksum((FILE *)argname,chksum,pdf._4_4_);
  }
  sVar6 = fread((void *)((long)&fw + 7),1,1,(FILE *)argname);
  if (sVar6 != 1) {
    fclose((FILE *)argname);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x14b,"Read mixture weights for %d senones: %d features x %d codewords\n",
            (ulong)*(uint *)file_name_local,(ulong)*(uint *)(file_name_local + 4),
            CONCAT44(uVar8,uStack_7c));
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,0x146,"More data than expected in %s\n",mixwfloor_local);
  exit(1);
}

Assistant:

static int32 senone_mixw_read(logmath_t * logmath, senone_t *s, const char *file_name, float64 mixwfloor)
{
    FILE *fp;
    char **argname, **argval;
    int32 byteswap, chksum_present;
    uint32 chksum;
    float32 *pdf;
    int32 i, j, f, m, c, p, n_sen, n_err, n_cw, nval;
    char eofchk;
    mixw_t *fw;
    
    E_INFO("Reading senone mixture weights: %s\n", file_name);
    
    if ((fp = fopen(file_name, "rb")) == NULL)
	E_FATAL_SYSTEM("fopen(%s,rb) failed\n", file_name);
    
    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr (fp, &argname, &argval, &byteswap) < 0)
	E_FATAL("bio_readhdr(%s) failed\n", file_name);
    
    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
	if (strcmp (argname[i], "version") == 0) {
	    if (strcmp(argval[i], MIXW_PARAM_VERSION) != 0)
		E_WARN("Version mismatch(%s): %s, expecting %s\n",
			file_name, argval[i], MIXW_PARAM_VERSION);
	} else if (strcmp (argname[i], "chksum0") == 0) {
	    chksum_present = 1;	/* Ignore the associated value */
	}
    }
    bio_hdrarg_free (argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* Read #senones, #features, #codewords, arraysize */
    n_sen = s->n_sen;
    if ((bio_fread (&(s->n_sen),  sizeof(int32), 1, fp, byteswap, &chksum) != 1) ||
	(bio_fread (&(s->n_feat), sizeof(int32), 1, fp, byteswap, &chksum) != 1) ||
	(bio_fread (&(n_cw),   sizeof(int32), 1, fp, byteswap, &chksum) != 1) ||
	(bio_fread (&nval,   sizeof(int32), 1, fp, byteswap, &chksum) != 1)) {
	E_FATAL("bio_fread(%s) (arraysize) failed\n", file_name);
    }
    if ((n_sen != 0) && (s->n_sen != n_sen))
	E_FATAL("#senones(%d) conflict with mapping file(%d)\n", s->n_sen, n_sen);
    if (s->n_sen >= MAX_SENID)
	E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", file_name, s->n_sen, MAX_SENID);
    if (s->n_feat <= 0)
	E_FATAL("Bad #features: %d\n", s->n_feat);
    if (n_cw <= 0)
	E_FATAL("Bad #mixing-wts/senone: %d\n", n_cw);
    
    /* Allocate sen2mgau map if not yet done so (i.e. no explicit mapping file given */
    if (! s->sen2mgau) {
	assert ((s->n_mgau == 0) || (s->n_mgau == 1));
	
	s->sen2mgau = (uint32 *) ckd_calloc (s->n_sen, sizeof(int32));
	
	if (s->n_mgau == 1) {
	    /* Semicontinuous mode; all senones map to single, shared gaussian: 0 */
	    for (i = 0; i < s->n_sen; i++)
		s->sen2mgau[i] = 0;
	} else {
	    /* Fully continuous mode; each senone maps to own parent gaussian */
	    s->n_mgau = s->n_sen;
	    for (i = 0; i < s->n_sen; i++)
		s->sen2mgau[i] = i;
	}
    } else
	assert (s->n_mgau != 0);
    if (s->n_mgau >= MAX_MGAUID)
	E_FATAL("%s: #gauden (%d) exceeds limit (%d)\n", file_name, s->n_mgau, MAX_MGAUID);
    
    if (nval != s->n_sen * s->n_feat * n_cw) {
	E_FATAL("%s: #float32 values(%d) doesn't match dimensions: %d x %d x %d\n",
		file_name, nval, s->n_sen, s->n_feat, n_cw);
    }
    
    /*
     * Compute #LSB bits to be dropped to represent mixwfloor with 8 bits.
     * All PDF values will be truncated (in the LSB positions) by these many bits.
     */
    if ((mixwfloor <= 0.0) || (mixwfloor >= 1.0))
	E_FATAL("mixwfloor (%e) not in range (0, 1)\n", mixwfloor);

    /* Allocate memory for s->mgau2sen and senone PDF data */
    build_mgau2sen (s, n_cw);
    
    /* Temporary structure to read in floats */
    pdf = (float32 *) ckd_calloc (n_cw, sizeof(float32));

    /* Read senone probs data, normalize, floor, convert to logs3, truncate to 8 bits */
    n_err = 0;
    for (i = 0; i < s->n_sen; i++) {
	m = s->sen2mgau[i];	/* Parent mgau */
	j = s->mgau2sen_idx[i];	/* Index of senone i within list of senones for mgau m */
	fw = s->mgau2sen[m].feat_mixw;

	for (f = 0; f < s->n_feat; f++) {
	    if (bio_fread((void *)pdf, sizeof(float32), n_cw, fp, byteswap, &chksum)
		!= n_cw) {
		E_FATAL("bio_fread(%s) (arraydata) failed\n", file_name);
	    }
	    
	    /* Normalize and floor */
	    if (vector_sum_norm (pdf, n_cw) == 0.0)
		n_err++;
	    vector_floor (pdf, n_cw, mixwfloor);
	    vector_sum_norm (pdf, n_cw);

	    /* Convert to logs3, truncate to 8 bits, and store in s->pdf */
	    for (c = 0; c < n_cw; c++) {
		p = -logmath_log(logmath, pdf[c]);
		fw[f].prob[j][c] = p;
	    }
	}
    }
    if (n_err > 0)
	E_WARN("Weight normalization failed for %d senones\n", n_err);

    ckd_free (pdf);

    if (chksum_present)
	bio_verify_chksum (fp, byteswap, chksum);
    
    if (fread (&eofchk, 1, 1, fp) == 1)
	E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    E_INFO("Read mixture weights for %d senones: %d features x %d codewords\n",
	   s->n_sen, s->n_feat, n_cw);
    
    return 0;
}